

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::~Builder(Builder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppIVar2;
  pointer puVar3;
  pointer ppcVar4;
  pointer pcVar5;
  
  this->_vptr_Builder = (_func_int **)&PTR__Builder_00b0da18;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->debugSourceId)._M_h);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::_M_erase(&(this->debugId)._M_t,
             (_Link_type)(this->debugId)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::_M_erase(&(this->includeFiles)._M_t,
             (_Link_type)(this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->stringIds)._M_h);
  std::_Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>::
  ~_Deque_base((_Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_> *)
               &this->loops);
  std::_Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>::~_Deque_base
            ((_Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_> *)&this->switchMerges);
  ppIVar2 = (this->nullConstants).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar2 != (pointer)0x0) {
    operator_delete(ppIVar2,(long)(this->nullConstants).
                                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar2
                   );
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->groupedDebugTypes)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->groupedTypes)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->groupedStructConstants)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->groupedConstants)._M_h);
  std::
  vector<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_std::allocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ::~vector(&this->functions);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->externals);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->constantsTypesGlobals);
  std::
  _Rb_tree<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::_Identity<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::_M_erase(&(this->decorations)._M_t,
             (_Link_type)(this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->names);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->executionModes);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->entryPoints);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->imports);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->strings);
  puVar3 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->accessChain).swizzle.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  puVar3 = (this->accessChain).indexChain.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->accessChain).indexChain.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  Module::~Module(&this->module);
  std::
  _Rb_tree<spv::Capability,_spv::Capability,_std::_Identity<spv::Capability>,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
  ::_M_erase(&(this->capabilities)._M_t,
             (_Link_type)(this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            );
  ppcVar4 = (this->moduleProcesses).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar4 != (pointer)0x0) {
    operator_delete(ppcVar4,(long)(this->moduleProcesses).
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar4)
    ;
  }
  ppcVar4 = (this->sourceExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar4 != (pointer)0x0) {
    operator_delete(ppcVar4,(long)(this->sourceExtensions).
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar4)
    ;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&(this->extensions)._M_t,
             (_Link_type)(this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&this->currentDebugScopeId)
  ;
  pcVar5 = (this->sourceText)._M_dataplus._M_p;
  paVar1 = &(this->sourceText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->debugTypeLocs)._M_h);
  return;
}

Assistant:

Builder::~Builder()
{
}